

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O1

uint32 __thiscall rw::Material::streamGetSize(Material *this)

{
  uint32 uVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = 0x1c;
  if (0x303ff < version) {
    iVar3 = 0x28;
  }
  if (this->texture != (Texture *)0x0) {
    uVar1 = Texture::streamGetSize(this->texture);
    iVar3 = iVar3 + uVar1 + 0xc;
  }
  iVar2 = PluginList::streamGetSize((PluginList *)&s_plglist,this);
  return iVar2 + iVar3 + 0xc;
}

Assistant:

uint32
Material::streamGetSize(void)
{
	uint32 size = 0;
	size += 12 + sizeof(MatStreamData);
	if(rw::version >= 0x30400)
		size += 12;
	if(this->texture)
		size += 12 + this->texture->streamGetSize();
	size += 12 + s_plglist.streamGetSize(this);
	return size;
}